

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O1

int KINSetMaxBetaFails(void *kinmem,long mxnbcf)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar1 = -1;
    error_code = -1;
  }
  else {
    if (-1 < mxnbcf) {
      if (mxnbcf == 0) {
        *(undefined8 *)((long)kinmem + 0x48) = 10;
      }
      else {
        *(long *)((long)kinmem + 0x48) = mxnbcf;
      }
      return 0;
    }
    msgfmt = "mxbcf < 0 illegal.";
    iVar1 = -2;
    error_code = -2;
  }
  KINProcessError((KINMem)0x0,error_code,"KINSOL","KINSetMaxBetaFails",msgfmt);
  return iVar1;
}

Assistant:

int KINSetMaxBetaFails(void *kinmem, long int mxnbcf)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetMaxBetaFails", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;

  if (mxnbcf < 0) {
    KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetMaxBetaFails", MSG_BAD_MXNBCF);
    return(KIN_ILL_INPUT);
  }

  if (mxnbcf == 0)
    kin_mem->kin_mxnbcf = MXNBCF_DEFAULT;
  else
    kin_mem->kin_mxnbcf = mxnbcf;

  return(KIN_SUCCESS);

}